

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Engineer *this;
  Manager *this_00;
  SalaryVisitor *this_01;
  VacationVisitor *this_02;
  
  this = (Engineer *)operator_new(0x10);
  Engineer::Engineer(this,10000.0,5);
  this_00 = (Manager *)operator_new(0x10);
  Manager::Manager(this_00,20000.0,7);
  this_01 = (SalaryVisitor *)operator_new(8);
  SalaryVisitor::SalaryVisitor(this_01);
  this_02 = (VacationVisitor *)operator_new(8);
  VacationVisitor::VacationVisitor(this_02);
  (**(this->super_Element)._vptr_Element)(this,this_01);
  (**(this_00->super_Element)._vptr_Element)(this_00,this_01);
  (**(this->super_Element)._vptr_Element)(this,this_02);
  (**(this_00->super_Element)._vptr_Element)(this_00,this_02);
  operator_delete(this,8);
  operator_delete(this_00,8);
  (*(this_01->super_Visitor)._vptr_Visitor[1])(this_01);
  (*(this_02->super_Visitor)._vptr_Visitor[1])(this_02);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	Element* engineer = new Engineer(10000, 5);
	Element* manager = new Manager(20000, 7);

	Visitor* salaryVisitor = new SalaryVisitor();
	Visitor* vacationVisitor = new VacationVisitor();

	engineer->accept(salaryVisitor);
	manager->accept(salaryVisitor);

	engineer->accept(vacationVisitor);
	manager->accept(vacationVisitor);

	delete engineer;
	delete manager;
	delete salaryVisitor;
	delete vacationVisitor;

	return 0;
}